

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_addc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  TCGv_i32 t;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 carry;
  DisasCompare_conflict2 cmp;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  cmp.u.s64.b = (TCGv_i64)o;
  tcg_gen_add_i64(tcg_ctx_00,o->out,o->in1,o->in2);
  disas_jcc(s,(DisasCompare_conflict2 *)&carry,3);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  if ((carry._1_1_ & 1) == 0) {
    ret_00 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_setcond_i32_s390x(tcg_ctx_00,(uint)(byte)carry,ret_00,(TCGv_i32)cmp._0_8_,cmp.u.s32.a);
    tcg_gen_extu_i32_i64_s390x(tcg_ctx_00,ret,ret_00);
    tcg_temp_free_i32(tcg_ctx_00,ret_00);
  }
  else {
    tcg_gen_setcond_i64_s390x(tcg_ctx_00,(uint)(byte)carry,ret,(TCGv_i64)cmp._0_8_,cmp.u.s64.a);
  }
  free_compare(tcg_ctx_00,(DisasCompare_conflict2 *)&carry);
  tcg_gen_add_i64(tcg_ctx_00,*(TCGv_i64 *)(cmp.u.s64.b + 8),*(TCGv_i64 *)(cmp.u.s64.b + 8),ret);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_addc(DisasContext *s, DisasOps *o)
{
    DisasCompare cmp;
    TCGv_i64 carry;
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_add_i64(tcg_ctx, o->out, o->in1, o->in2);

    /* The carry flag is the msb of CC, therefore the branch mask that would
       create that comparison is 3.  Feeding the generated comparison to
       setcond produces the carry flag that we desire.  */
    disas_jcc(s, &cmp, 3);
    carry = tcg_temp_new_i64(tcg_ctx);
    if (cmp.is_64) {
        tcg_gen_setcond_i64(tcg_ctx, cmp.cond, carry, cmp.u.s64.a, cmp.u.s64.b);
    } else {
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_setcond_i32(tcg_ctx, cmp.cond, t, cmp.u.s32.a, cmp.u.s32.b);
        tcg_gen_extu_i32_i64(tcg_ctx, carry, t);
        tcg_temp_free_i32(tcg_ctx, t);
    }
    free_compare(tcg_ctx, &cmp);

    tcg_gen_add_i64(tcg_ctx, o->out, o->out, carry);
    tcg_temp_free_i64(tcg_ctx, carry);
    return DISAS_NEXT;
}